

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom-bounds.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer *pppLVar1;
  pointer *ppdVar2;
  pointer *ppdVar3;
  pointer *ppbVar4;
  pointer *pppLVar5;
  bool bVar6;
  _List_node_base *p_Var7;
  QueuePolicy *pQVar8;
  int i;
  long lVar9;
  int iVar10;
  string_view format_str;
  format_args args;
  bool help;
  _Any_data local_31e8;
  undefined1 local_31d8 [28];
  int tot_blocks;
  opts local_31b8 [8];
  _List_node_base *local_31b0;
  _List_node_base *local_31a8;
  int nvals;
  communicator world;
  _Any_data local_3178;
  _Manager_type local_3168;
  _Invoker_type p_Stack_3160;
  _Any_data local_3158;
  undefined1 local_3148 [8];
  _Invoker_type p_Stack_3140;
  pointer local_3138;
  pointer ppvStack_3130;
  pointer local_3128;
  DestroyBlock local_3118;
  CreateBlock local_30f8;
  LoadBlock local_30d8;
  SaveBlock local_30b8;
  DestroyBlock local_3098;
  CreateBlock local_3078;
  ContiguousAssigner read_assigner;
  ContiguousAssigner assigner;
  environment env;
  Options ops;
  _Any_data local_2ff8;
  code *local_2fe8;
  undefined8 uStack_2fe0;
  _Any_data local_2fd8;
  pointer local_2fc8;
  undefined8 uStack_2fc0;
  DivisionsVector local_2fb8;
  CoordinateVector local_2f98;
  undefined1 local_2f78 [16];
  bool local_2f68;
  communicator local_2f60;
  _Any_data local_2f48;
  _Manager_type local_2f38;
  code *local_2f30;
  LoadBlock local_2f28;
  _Any_data local_2f08;
  code *local_2ef8;
  unsigned_long uStack_2ef0;
  Bounds dom_bounds;
  FileStorage storage;
  Decomposer decomposer;
  Master read_master;
  Master master;
  
  read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(read_master.links_.
                         super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,argc);
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)argv;
  MPI_Init_thread(&read_master,&master,1);
  world.comm_.data = (MPI_Comm)&ompi_mpi_comm_world;
  world.rank_ = 0;
  world.size_ = 1;
  world.owner_ = false;
  MPI_Comm_rank();
  MPI_Comm_size(world.comm_.data);
  tot_blocks = world.size_;
  nvals = 100;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops.options;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.failed = false;
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.args.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::_M_construct<char_const*>((string *)&master,"tot_blocks","");
  pppLVar1 = &read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppLVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&read_master," total number of blocks","");
  opts::Option<int>((opts *)&local_31a8,'b',(string *)&master,&tot_blocks,(string *)&read_master);
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = local_31a8;
  local_31a8 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  ppdVar2 = &decomposer.domain.min.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.
             m_begin;
  decomposer._0_8_ = ppdVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&decomposer,"nvals","");
  ppdVar3 = &dom_bounds.min.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.m_end;
  dom_bounds.min.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>._0_8_ = ppdVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&dom_bounds," number of values per block","");
  opts::Option<int>((opts *)&local_31b0,'n',(string *)&decomposer,&nvals,(string *)&dom_bounds);
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = local_31b0;
  local_31b0 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  ppbVar4 = &storage.filename_templates_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  storage.super_ExternalStorage._vptr_ExternalStorage = (_func_int **)ppbVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&storage,"help","");
  local_31e8._M_unused._M_object = local_31d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_31e8," show help","");
  opts::Option<bool>(local_31b8,'h',(string *)&storage,&help,(string *)&local_31e8);
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = (_List_node_base *)local_31b8;
  local_31b8 = (opts  [8])0x0;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  if (local_31b8 != (opts  [8])0x0) {
    (**(code **)(*(long *)local_31b8 + 8))();
  }
  local_31b8[0] = (opts)0x0;
  local_31b8[1] = (opts)0x0;
  local_31b8[2] = (opts)0x0;
  local_31b8[3] = (opts)0x0;
  local_31b8[4] = (opts)0x0;
  local_31b8[5] = (opts)0x0;
  local_31b8[6] = (opts)0x0;
  local_31b8[7] = (opts)0x0;
  if ((Master *)local_31e8._M_unused._0_8_ != (Master *)local_31d8) {
    operator_delete(local_31e8._M_unused._M_object,(ulong)(local_31d8._0_8_ + 1));
  }
  if ((pointer *)storage.super_ExternalStorage._vptr_ExternalStorage != ppbVar4) {
    operator_delete(storage.super_ExternalStorage._vptr_ExternalStorage,
                    (ulong)((long)&((storage.filename_templates_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p
                           + 1));
  }
  if (local_31b0 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_31b0 + 8))();
  }
  local_31b0 = (_List_node_base *)0x0;
  if ((pointer *)dom_bounds.min.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>._0_8_
      != ppdVar3) {
    operator_delete((void *)dom_bounds.min.
                            super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>._0_8_,
                    (long)dom_bounds.min.
                          super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.m_end + 1);
  }
  pppLVar5 = &master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  if ((pointer *)decomposer._0_8_ != ppdVar2) {
    operator_delete((void *)decomposer._0_8_,
                    (long)decomposer.domain.min.
                          super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.m_begin + 1)
    ;
  }
  if (local_31a8 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_31a8 + 8))();
  }
  local_31a8 = (_List_node_base *)0x0;
  if (read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppLVar1) {
    operator_delete(read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)read_master.links_.
                          super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppLVar5) {
    operator_delete(master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)master.links_.
                          super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  bVar6 = opts::Options::parse(&ops,argc,argv);
  if ((bVar6) && (help != true)) {
    master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pppLVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&master,"./DIY.XXXXXX","");
    storage.super_ExternalStorage._vptr_ExternalStorage = (_func_int **)&PTR_put_001490e0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&storage.filename_templates_,1,(value_type *)&master,(allocator_type *)&read_master);
    storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header;
    storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    storage.filenames_.m_.mLock = 0;
    storage.max_size_.x_ = 0;
    storage.max_size_.m_.mLock = 0;
    storage.count_.x_ = 0;
    storage.count_.m_.mLock = 0;
    storage.current_size_.x_ = 0;
    storage.current_size_.m_.mLock = 0;
    storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)pppLVar5) {
      operator_delete(master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)master.links_.
                            super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
    local_2f60.comm_.data = world.comm_.data;
    local_2f60.rank_ = world.rank_;
    local_2f60.size_ = world.size_;
    local_2f60.owner_ = false;
    local_3078.super__Function_base._M_functor._8_4_ = 0;
    local_3078.super__Function_base._M_functor._12_4_ = 0;
    local_3078.super__Function_base._M_functor._M_unused._M_object = Block::create;
    local_3078._M_invoker = std::_Function_handler<void_*(),_void_*(*)()>::_M_invoke;
    local_3078.super__Function_base._M_manager =
         std::_Function_handler<void_*(),_void_*(*)()>::_M_manager;
    local_3098.super__Function_base._M_functor._8_8_ = (QueuePolicy *)0x0;
    local_3098.super__Function_base._M_functor._M_unused._M_object = Block::destroy;
    local_3098._M_invoker = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
    local_3098.super__Function_base._M_manager =
         std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
    local_30b8.super__Function_base._M_functor._8_8_ = (_Base_ptr)0x0;
    local_30b8.super__Function_base._M_functor._M_unused._M_object = Block::save;
    local_30b8._M_invoker =
         std::
         _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
         ::_M_invoke;
    local_30b8.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
         ::_M_manager;
    local_30d8.super__Function_base._M_functor._8_8_ = (pointer)0x0;
    local_30d8.super__Function_base._M_functor._M_unused._M_object = Block::load;
    local_30d8._M_invoker =
         std::
         _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
         ::_M_invoke;
    local_30d8.super__Function_base._M_manager =
         std::
         _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
         ::_M_manager;
    pQVar8 = (QueuePolicy *)operator_new(0x10);
    pQVar8->_vptr_QueuePolicy = (_func_int **)&PTR_unload_incoming_00149280;
    pQVar8[1]._vptr_QueuePolicy = (_func_int **)0x1000;
    diy::Master::Master(&master,&local_2f60,1,-1,&local_3078,&local_3098,
                        &storage.super_ExternalStorage,&local_30b8,&local_30d8,pQVar8);
    if (local_30d8.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_30d8.super__Function_base._M_manager)
                ((_Any_data *)&local_30d8,(_Any_data *)&local_30d8,__destroy_functor);
    }
    if ((_Base_ptr)local_30b8.super__Function_base._M_manager != (_Base_ptr)0x0) {
      (*local_30b8.super__Function_base._M_manager)(&local_30b8,&local_30b8,3);
    }
    if (local_3098.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_3098.super__Function_base._M_manager)
                ((_Any_data *)&local_3098,(_Any_data *)&local_3098,__destroy_functor);
    }
    if (local_3078.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_3078.super__Function_base._M_manager)
                ((_Any_data *)&local_3078,(_Any_data *)&local_3078,__destroy_functor);
    }
    diy::mpi::communicator::~communicator(&local_2f60);
    assigner.super_StaticAssigner.super_Assigner.size_ = world.size_;
    assigner.super_StaticAssigner.super_Assigner.nblocks_ = tot_blocks;
    assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
         (_func_int **)&PTR__Assigner_001492d8;
    diy::Bounds<double>::Bounds(&dom_bounds,3);
    lVar9 = 0;
    do {
      dom_bounds.min.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.m_begin[lVar9] =
           -1.0;
      dom_bounds.max.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.m_begin[lVar9] =
           1.0;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    local_3148 = (undefined1  [8])0x0;
    p_Stack_3140 = (_Invoker_type)0x0;
    local_3138 = (pointer)0x0;
    ppvStack_3130 = (pointer)0x0;
    local_3128 = (pointer)0x0;
    local_3178._M_unused._M_object = (void *)0x0;
    local_3178._8_8_ = 0;
    local_3168 = (_Manager_type)0x0;
    p_Stack_3160 = (_Invoker_type)0x0;
    local_3158._M_unused._M_object = (void *)0x0;
    local_2f98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2f98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_2f98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_2fb8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2fb8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_2fb8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    diy::RegularDecomposer<diy::Bounds<double>_>::RegularDecomposer
              (&decomposer,3,&dom_bounds,tot_blocks,(BoolVector *)local_3148,
               (BoolVector *)&local_3178,&local_2f98,&local_2fb8);
    if ((element_type *)
        local_2fb8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (element_type *)0x0) {
      operator_delete(local_2fb8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2fb8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2fb8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((_Hash_node_base *)
        local_2f98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (_Hash_node_base *)0x0) {
      operator_delete(local_2f98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2f98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2f98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_3178._M_unused._M_object != (void *)0x0) {
      operator_delete(local_3178._M_unused._M_object,
                      (long)local_3158._M_unused._0_8_ - local_3178._0_8_);
      local_3178._M_unused._M_object = (void *)0x0;
      local_3178._8_8_ = local_3178._8_8_ & 0xffffffff00000000;
      local_3168 = (_Manager_type)0x0;
      p_Stack_3160 = (_Invoker_type)((ulong)p_Stack_3160 & 0xffffffff00000000);
      local_3158._M_unused._M_object = (void *)0x0;
    }
    if (local_3148 != (undefined1  [8])0x0) {
      operator_delete((void *)local_3148,(long)local_3128 - (long)local_3148);
      local_3148 = (undefined1  [8])0x0;
      p_Stack_3140 = (_Invoker_type)((ulong)p_Stack_3140 & 0xffffffff00000000);
      local_3138 = (pointer)0x0;
      ppvStack_3130 = (pointer)((ulong)ppvStack_3130 & 0xffffffff00000000);
      local_3128 = (pointer)0x0;
    }
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    read_master.blocks_.create_.super__Function_base._M_functor._M_unused._M_object =
         std::
         _Function_handler<void_(int,_diy::Bounds<double>,_diy::Bounds<double>,_diy::Bounds<double>,_diy::RegularLink<diy::Bounds<double>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/custom-bounds.cpp:152:26)>
         ::_M_invoke;
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Function_handler<void_(int,_diy::Bounds<double>,_diy::Bounds<double>,_diy::Bounds<double>,_diy::RegularLink<diy::Bounds<double>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/custom-bounds.cpp:152:26)>
                  ::_M_manager;
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&master;
    diy::RegularDecomposer<diy::Bounds<double>_>::decompose
              (&decomposer,world.rank_,&assigner.super_StaticAssigner,(Creator *)&read_master);
    if (read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      (*(code *)read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)(&read_master,&read_master,3);
    }
    local_31e8._M_unused._M_object = (void *)0x0;
    local_31e8._8_8_ = 0;
    local_31d8._8_8_ =
         std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_invoke;
    local_31d8._0_8_ =
         std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_manager
    ;
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&nvals;
    read_master.blocks_.create_.super__Function_base._M_functor._M_unused._M_object =
         std::
         _Function_handler<void_(Block_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/custom-bounds.cpp:156:20)>
         ::_M_invoke;
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Function_handler<void_(Block_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/custom-bounds.cpp:156:20)>
                  ::_M_manager;
    diy::Master::foreach_<Block>(&master,(Callback<Block> *)&read_master,(Skip *)&local_31e8);
    if (read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      (*(code *)read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)(&read_master,&read_master,3);
    }
    if ((pointer)local_31d8._0_8_ != (pointer)0x0) {
      (*(code *)local_31d8._0_8_)(&local_31e8,&local_31e8,3);
    }
    local_31e8._M_unused._M_object = Block::print_data;
    local_31e8._8_8_ = 0;
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    read_master.blocks_.create_.super__Function_base._M_functor._M_unused._M_object =
         std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_invoke;
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
                  _M_manager;
    diy::Master::foreach<void(Block::*)(diy::Master::ProxyWithLink_const&)>
              (&master,(offset_in_Block_to_subr *)local_31e8._M_pod_data,(Skip *)&read_master);
    if (read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      (*(code *)read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)(&read_master,&read_master,3);
    }
    local_31e8._M_unused._M_object = local_31d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_31e8,"test.out","");
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__MemoryBuffer_00149428;
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    read_master.blocks_.create_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    read_master.blocks_.create_.super__Function_base._M_functor._8_8_ = 0;
    read_master.blocks_.create_.super__Function_base._M_manager = (_Manager_type)0x0;
    read_master.blocks_.create_._M_invoker = (_Invoker_type)0x0;
    read_master.blocks_.destroy_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    read_master.blocks_.destroy_.super__Function_base._M_functor._8_8_ = 0;
    local_2f08._M_unused._M_object = (void *)0x0;
    local_2f08._8_8_ = 0;
    local_2ef8 = (code *)0x0;
    uStack_2ef0 = 0;
    diy::io::write_blocks
              ((string *)&local_31e8,&world,&master,(MemoryBuffer *)&read_master,
               (SaveBlock *)&local_2f08);
    if (local_2ef8 != (code *)0x0) {
      (*local_2ef8)(&local_2f08,&local_2f08,__destroy_functor);
    }
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__MemoryBuffer_00149428;
    std::vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>::~vector
              ((vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_> *)
               &read_master.blocks_.create_._M_invoker);
    if (read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(read_master.links_.
                      super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      read_master.blocks_.create_.super__Function_base._M_functor._8_8_ -
                      (long)read_master.links_.
                            super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    }
    if ((undefined1 *)local_31e8._M_unused._0_8_ != local_31d8) {
      operator_delete(local_31e8._M_unused._M_object,(ulong)(local_31d8._0_8_ + 1));
    }
    local_2f78._0_8_ = world.comm_.data;
    local_2f78._8_4_ = world.rank_;
    local_2f78._12_4_ = world.size_;
    local_2f68 = false;
    local_30f8.super__Function_base._M_functor._8_8_ = 0;
    local_30f8.super__Function_base._M_functor._M_unused._M_object = Block::create;
    local_30f8._M_invoker = std::_Function_handler<void_*(),_void_*(*)()>::_M_invoke;
    local_30f8.super__Function_base._M_manager =
         std::_Function_handler<void_*(),_void_*(*)()>::_M_manager;
    local_3118.super__Function_base._M_functor._8_8_ = (pointer)0x0;
    local_3118.super__Function_base._M_functor._M_unused._M_object = Block::destroy;
    local_3118._M_invoker = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
    local_3118.super__Function_base._M_manager =
         std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
    local_2fd8._M_unused._M_object = (pointer)0x0;
    local_2fd8._8_8_ = (pointer)0x0;
    local_2fc8 = (pointer)0x0;
    uStack_2fc0._0_4_ = 0;
    uStack_2fc0._4_4_ = 0;
    local_2fe8 = (code *)0x0;
    uStack_2fe0._0_1_ = false;
    uStack_2fe0._1_7_ = 0;
    local_2ff8._M_unused._M_object = (void *)0x0;
    local_2ff8._8_8_ =
         (__uniq_ptr_impl<diy::Master::CollectivesMap,_std::default_delete<diy::Master::CollectivesMap>_>
          )0x0;
    pQVar8 = (QueuePolicy *)operator_new(0x10);
    pQVar8->_vptr_QueuePolicy = (_func_int **)&PTR_unload_incoming_00149280;
    pQVar8[1]._vptr_QueuePolicy = (_func_int **)0x1000;
    diy::Master::Master(&read_master,(communicator *)local_2f78,1,-1,&local_30f8,&local_3118,
                        (ExternalStorage *)0x0,(SaveBlock *)&local_2fd8,(LoadBlock *)&local_2ff8,
                        pQVar8);
    if (local_2fe8 != (code *)0x0) {
      (*local_2fe8)(&local_2ff8,&local_2ff8,__destroy_functor);
    }
    if (local_2fc8 != (pointer)0x0) {
      (*(code *)local_2fc8)(&local_2fd8,&local_2fd8,3);
    }
    if (local_3118.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_3118.super__Function_base._M_manager)
                ((_Any_data *)&local_3118,(_Any_data *)&local_3118,__destroy_functor);
    }
    if ((__pthread_internal_list *)local_30f8.super__Function_base._M_manager !=
        (__pthread_internal_list *)0x0) {
      (*local_30f8.super__Function_base._M_manager)(&local_30f8,&local_30f8,3);
    }
    diy::mpi::communicator::~communicator((communicator *)local_2f78);
    read_assigner.super_StaticAssigner.super_Assigner.size_ = world.size_;
    read_assigner.super_StaticAssigner.super_Assigner.nblocks_ = -1;
    read_assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
         (_func_int **)&PTR__Assigner_001492d8;
    local_31e8._M_unused._M_object = local_31d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_31e8,"test.out","");
    local_2f28.super__Function_base._M_functor._8_8_ = 0;
    local_2f28.super__Function_base._M_functor._M_unused._M_object = Block::load;
    local_2f28._M_invoker =
         std::
         _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
         ::_M_invoke;
    local_2f28.super__Function_base._M_manager =
         std::
         _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
         ::_M_manager;
    diy::io::read_blocks
              ((string *)&local_31e8,&world,&read_assigner.super_StaticAssigner,&read_master,
               &local_2f28);
    if (local_2f28.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_2f28.super__Function_base._M_manager)
                ((_Any_data *)&local_2f28,(_Any_data *)&local_2f28,__destroy_functor);
    }
    if ((undefined1 *)local_31e8._M_unused._0_8_ != local_31d8) {
      operator_delete(local_31e8._M_unused._M_object,(ulong)(local_31d8._0_8_ + 1));
    }
    local_31e8._M_unused._M_member_pointer =
         (ulong)((long)read_master.blocks_.elements_.
                       super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)read_master.blocks_.elements_.
                      super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
    format_str.size_ = 0x19;
    format_str.data_ = "{} blocks read from file\n";
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &local_31e8;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = 2;
    fmt::v7::vprint(_stderr,format_str,args);
    local_2f48._M_unused._M_object = Block::print_data;
    local_2f48._8_8_ = (__node_base_ptr)0x0;
    local_31e8._M_unused._M_object = (void *)0x0;
    local_31e8._8_8_ = 0;
    local_31d8._8_8_ =
         std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_invoke;
    local_31d8._0_8_ =
         std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_manager
    ;
    diy::Master::foreach<void(Block::*)(diy::Master::ProxyWithLink_const&)>
              (&read_master,(offset_in_Block_to_subr *)local_2f48._M_pod_data,(Skip *)&local_31e8);
    if ((pointer)local_31d8._0_8_ != (pointer)0x0) {
      (*(code *)local_31d8._0_8_)(&local_31e8,&local_31e8,3);
    }
    local_2f48._M_unused._M_object = (code *)0x0;
    local_2f48._8_8_ = (__node_base_ptr)0x0;
    local_2f30 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
                 _M_invoke;
    local_2f38 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
                 _M_manager;
    local_31e8._M_unused._M_object = &master;
    local_31d8._8_8_ =
         std::
         _Function_handler<void_(Block_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/custom-bounds.cpp:180:20)>
         ::_M_invoke;
    local_31d8._0_8_ =
         std::
         _Function_handler<void_(Block_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/custom-bounds.cpp:180:20)>
         ::_M_manager;
    local_31e8._8_8_ = &read_master;
    diy::Master::foreach_<Block>
              ((Master *)local_31e8._M_unused._0_8_,(Callback<Block> *)&local_31e8,
               (Skip *)&local_2f48);
    if ((pointer)local_31d8._0_8_ != (pointer)0x0) {
      (*(code *)local_31d8._0_8_)(&local_31e8,&local_31e8,3);
    }
    if (local_2f38 != (_Manager_type)0x0) {
      (*local_2f38)(&local_2f48,&local_2f48,__destroy_functor);
    }
    diy::Master::~Master(&read_master);
    diy::RegularDecomposer<diy::Bounds<double>_>::~RegularDecomposer(&decomposer);
    dom_bounds.max.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.m_end =
         dom_bounds.max.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.m_begin;
    if (dom_bounds.max.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.m_dynamic_data
        != (pointer)0x0) {
      operator_delete(dom_bounds.max.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.
                      m_dynamic_data,
                      dom_bounds.max.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.
                      m_dynamic_capacity << 3);
    }
    dom_bounds.min.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.m_end =
         dom_bounds.min.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.m_begin;
    if (dom_bounds.min.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.m_dynamic_data
        != (pointer)0x0) {
      operator_delete(dom_bounds.min.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.
                      m_dynamic_data,
                      dom_bounds.min.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.
                      m_dynamic_capacity << 3);
    }
    diy::Master::~Master(&master);
    diy::FileStorage::~FileStorage(&storage);
    iVar10 = 0;
  }
  else {
    iVar10 = 1;
    if (world.rank_ == 0) {
      opts::operator<<((ostream *)&std::cout,&ops);
    }
  }
  std::__cxx11::
  _List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ::_M_clear(&ops.options.
              super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
            );
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ops);
  diy::mpi::communicator::~communicator(&world);
  MPI_Finalize();
  return iVar10;
}

Assistant:

int main(int argc, char** argv)
{
    // initialize MPI
    diy::mpi::environment  env(argc, argv);     // equivalent of MPI_Init(argc, argv)/MPI_Finalize()
    diy::mpi::communicator world;               // equivalent of MPI_COMM_WORLD

    int tot_blocks  = world.size();             // default number of global blocks
    int mem_blocks  = -1;                       // everything in core for now
    int num_threads = 1;                        // 1 thread for now
    int dom_dim     = 3;                        // domain dimensionality
    int nvals       = 100;                      // number of values per block

    // get command line arguments
    bool help;
    opts::Options ops;
    ops >> opts::Option('b', "tot_blocks",  tot_blocks, " total number of blocks")
        >> opts::Option('n', "nvals",       nvals,      " number of values per block")
        >> opts::Option('h', "help",        help,       " show help");

  if (!ops.parse(argc,argv) || help)
  {
        if (world.rank() == 0)
            std::cout << ops;
        return 1;
    }

    // initialize DIY
    diy::FileStorage          storage("./DIY.XXXXXX"); // used for blocks to be moved out of core
    diy::Master               master(world,
                                     num_threads,
                                     mem_blocks,
                                     &Block::create,
                                     &Block::destroy,
                                     &storage,
                                     &Block::save,
                                     &Block::load);
    diy::ContiguousAssigner   assigner(world.size(), tot_blocks);

    // set global domain bounds
    Bounds dom_bounds(dom_dim);
    for (int i = 0; i < dom_dim; ++i)
    {
        dom_bounds.min[i] = -1.0;
        dom_bounds.max[i] =  1.0;
    }

    // decompose the domain into blocks
    Decomposer decomposer(dom_dim, dom_bounds, tot_blocks);
    decomposer.decompose(world.rank(),
                         assigner,
                         [&](int gid, const Bounds& core, const Bounds& bounds, const Bounds& domain, const RCLink& link)
                         { Block::add(gid, core, bounds, domain, link, master); });

    // initialize
    master.foreach([&](Block* b, const diy::Master::ProxyWithLink& cp)
            { b->init_data(cp, nvals); });

    // debug: print the blocks
    master.foreach(&Block::print_data);

    // save the results in diy format
    diy::io::write_blocks("test.out", world, master);

    // read the results back
    diy::Master read_master(world,
            1,
            -1,
            &Block::create,
            &Block::destroy);
    diy::ContiguousAssigner   read_assigner(world.size(), -1);   // number of blocks set by read_blocks()

    diy::io::read_blocks("test.out", world, read_assigner, read_master, &Block::load);
    fmt::print(stderr, "{} blocks read from file\n", read_master.size());

    // debug: print the blocks
    read_master.foreach(&Block::print_data);

    // compare
    master.foreach([&](Block* b, const diy::Master::ProxyWithLink& cp)
            { b->compare_data(cp, master, read_master); });
}